

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall smf::Options::setModified(Options *this,string *optionName,string *aString)

{
  int iVar1;
  reference ppOVar2;
  int index;
  string *aString_local;
  string *optionName_local;
  Options *this_local;
  
  iVar1 = getRegIndex(this,optionName);
  if (-1 < iVar1) {
    iVar1 = getRegIndex(this,optionName);
    ppOVar2 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::
              operator[](&this->m_optionRegister,(long)iVar1);
    Option_register::setModified(*ppOVar2,aString);
  }
  return;
}

Assistant:

void Options::setModified(const std::string& optionName,
		const std::string& aString) {
   int index = getRegIndex(optionName);
   if (index < 0) {
      return;
   }

   m_optionRegister[getRegIndex(optionName)]->setModified(aString);
}